

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::GenerateXMLLaunched(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  string *name;
  bool bVar1;
  unsigned_long uVar2;
  char *fname;
  _Rb_tree_node_base *p_Var3;
  cmCTestBuildHandler *this_00;
  unsigned_long dindex;
  int iVar4;
  Directory launchDir;
  int local_f4;
  Fragments fragments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  cmFileTimeCache ftc;
  
  if ((this->CTestLaunchDir)._M_string_length != 0) {
    cmFileTimeCache::cmFileTimeCache(&ftc);
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar4 = this->MaxErrors;
    local_f4 = this->MaxWarnings;
    fragments._M_t._M_impl.super__Rb_tree_key_compare<cmCTestBuildHandler::FragmentCompare>.
    _M_key_compare.FTC = (FragmentCompare)(FragmentCompare)&ftc;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmsys::Directory::Directory(&launchDir);
    name = &this->CTestLaunchDir;
    cmsys::Directory::Load(&launchDir,name,(string *)0x0);
    uVar2 = cmsys::Directory::GetNumberOfFiles(&launchDir);
    for (dindex = 0; p_Var3 = fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        uVar2 != dindex; dindex = dindex + 1) {
      this_00 = (cmCTestBuildHandler *)&launchDir;
      fname = cmsys::Directory::GetFile((Directory *)this_00,dindex);
      bVar1 = IsLaunchedErrorFile(this_00,fname);
      if (bVar1 && iVar4 != 0) {
        std::operator+(&local_a8,name,'/');
        std::operator+(&local_88,&local_a8,fname);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
                    *)&fragments,&local_88);
        iVar4 = iVar4 + -1;
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        this->TotalErrors = this->TotalErrors + 1;
      }
      else {
        bVar1 = IsLaunchedWarningFile(this_00,fname);
        if (bVar1 && local_f4 != 0) {
          std::operator+(&local_a8,name,'/');
          std::operator+(&local_88,&local_a8,fname);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
                      *)&fragments,&local_88);
          local_f4 = local_f4 + -1;
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          this->TotalWarnings = this->TotalWarnings + 1;
        }
      }
    }
    for (; (_Rb_tree_header *)p_Var3 != &fragments._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      cmXMLWriter::FragmentFile(xml,*(char **)(p_Var3 + 1));
    }
    cmsys::Directory::~Directory(&launchDir);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&fragments._M_t);
    cmFileTimeCache::~cmFileTimeCache(&ftc);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLaunched(cmXMLWriter& xml)
{
  if (this->CTestLaunchDir.empty()) {
    return;
  }

  // Sort XML fragments in chronological order.
  cmFileTimeCache ftc;
  FragmentCompare fragmentCompare(&ftc);
  using Fragments = std::set<std::string, FragmentCompare>;
  Fragments fragments(fragmentCompare);

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  // Identify fragments on disk.
  cmsys::Directory launchDir;
  launchDir.Load(this->CTestLaunchDir);
  unsigned long n = launchDir.GetNumberOfFiles();
  for (unsigned long i = 0; i < n; ++i) {
    const char* fname = launchDir.GetFile(i);
    if (this->IsLaunchedErrorFile(fname) && numErrorsAllowed) {
      numErrorsAllowed--;
      fragments.insert(this->CTestLaunchDir + '/' + fname);
      ++this->TotalErrors;
    } else if (this->IsLaunchedWarningFile(fname) && numWarningsAllowed) {
      numWarningsAllowed--;
      fragments.insert(this->CTestLaunchDir + '/' + fname);
      ++this->TotalWarnings;
    }
  }

  // Copy the fragments into the final XML file.
  for (std::string const& f : fragments) {
    xml.FragmentFile(f.c_str());
  }
}